

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O3

ssize_t __thiscall
icu_63::StringTrieBuilder::ListBranchNode::write
          (ListBranchNode *this,int __fd,void *__buf,size_t __n)

{
  int32_t *piVar1;
  int iVar2;
  Node *pNVar3;
  Node *pNVar4;
  int iVar5;
  int32_t *piVar6;
  ssize_t sVar7;
  undefined4 in_register_00000034;
  long *plVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  plVar8 = (long *)CONCAT44(in_register_00000034,__fd);
  lVar9 = (long)this->length;
  pNVar3 = this->equal[lVar9 + -1];
  piVar1 = &(this->super_BranchNode).firstEdgeNumber;
  piVar6 = &pNVar3->offset;
  if (pNVar3 == (Node *)0x0) {
    piVar6 = piVar1;
  }
  iVar5 = *piVar6;
  do {
    pNVar4 = this->equal[lVar9 + -2];
    if (((pNVar4 != (Node *)0x0) && (iVar2 = pNVar4->offset, iVar2 < 0)) &&
       ((iVar2 < iVar5 || (*piVar1 < iVar2)))) {
      (*(pNVar4->super_UObject)._vptr_UObject[5])(pNVar4,plVar8);
    }
    lVar9 = lVar9 + -1;
  } while (1 < lVar9);
  iVar5 = this->length;
  lVar9 = (long)iVar5 + -1;
  if (pNVar3 == (Node *)0x0) {
    (**(code **)(*plVar8 + 0x88))(plVar8,this->values[(long)iVar5 + -1],1);
  }
  else {
    (*(pNVar3->super_UObject)._vptr_UObject[5])(pNVar3,plVar8);
    lVar9 = (long)(int)lVar9;
  }
  sVar7 = (**(code **)(*plVar8 + 0x78))(plVar8,this->units[lVar9]);
  (this->super_BranchNode).super_Node.offset = (int32_t)sVar7;
  if (1 < iVar5) {
    lVar9 = (ulong)(iVar5 - 2) + 0x2c;
    do {
      lVar10 = *(long *)((long)this + lVar9 * 8 + -0x148);
      if (lVar10 == 0) {
        iVar5 = *(int *)((long)this + lVar9 * 4 + -0x6c);
      }
      else {
        iVar5 = (int)sVar7 - *(int *)(lVar10 + 0xc);
      }
      (**(code **)(*plVar8 + 0x88))(plVar8,iVar5,lVar10 == 0);
      sVar7 = (**(code **)(*plVar8 + 0x78))
                        (plVar8,*(undefined2 *)((long)this->equal + lVar9 * 2 + -0x18));
      (this->super_BranchNode).super_Node.offset = (int32_t)sVar7;
      lVar10 = lVar9 + -0x2c;
      bVar11 = lVar9 != 0x2c;
      lVar9 = lVar9 + -1;
    } while (bVar11 && -1 < lVar10);
  }
  return sVar7;
}

Assistant:

void
StringTrieBuilder::ListBranchNode::write(StringTrieBuilder &builder) {
    // Write the sub-nodes in reverse order: The jump lengths are deltas from
    // after their own positions, so if we wrote the minUnit sub-node first,
    // then its jump delta would be larger.
    // Instead we write the minUnit sub-node last, for a shorter delta.
    int32_t unitNumber=length-1;
    Node *rightEdge=equal[unitNumber];
    int32_t rightEdgeNumber= rightEdge==NULL ? firstEdgeNumber : rightEdge->getOffset();
    do {
        --unitNumber;
        if(equal[unitNumber]!=NULL) {
            equal[unitNumber]->writeUnlessInsideRightEdge(firstEdgeNumber, rightEdgeNumber, builder);
        }
    } while(unitNumber>0);
    // The maxUnit sub-node is written as the very last one because we do
    // not jump for it at all.
    unitNumber=length-1;
    if(rightEdge==NULL) {
        builder.writeValueAndFinal(values[unitNumber], TRUE);
    } else {
        rightEdge->write(builder);
    }
    offset=builder.write(units[unitNumber]);
    // Write the rest of this node's unit-value pairs.
    while(--unitNumber>=0) {
        int32_t value;
        UBool isFinal;
        if(equal[unitNumber]==NULL) {
            // Write the final value for the one string ending with this unit.
            value=values[unitNumber];
            isFinal=TRUE;
        } else {
            // Write the delta to the start position of the sub-node.
            U_ASSERT(equal[unitNumber]->getOffset()>0);
            value=offset-equal[unitNumber]->getOffset();
            isFinal=FALSE;
        }
        builder.writeValueAndFinal(value, isFinal);
        offset=builder.write(units[unitNumber]);
    }
}